

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learner.cc
# Opt level: O3

bool LEARNER::ec_is_example_header(example *ec)

{
  wclass *pwVar1;
  
  pwVar1 = (ec->l).cs.costs._begin;
  if ((long)(ec->l).cs.costs._end - (long)pwVar1 == 0x10) {
    return (bool)(-(pwVar1->partial_prediction == -1.0) & 1);
  }
  return false;
}

Assistant:

bool ec_is_example_header(example& ec)
{
  v_array<CB::cb_class> costs = ec.l.cb.costs;
  if (costs.size() != 1)
    return false;
  if (costs[0].probability == -1.f)
    return true;
  return false;
}